

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnVector<int>::Append(ColumnVector<int> *this,ColumnRef *column)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  iterator this_00;
  Column *in_RSI;
  shared_ptr<clickhouse::ColumnVector<int>_> col;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff80
  ;
  const_iterator in_stack_ffffffffffffffd8;
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2143d3);
  Column::As<clickhouse::ColumnVector<int>>(in_RSI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    __first = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              (in_stack_ffffffffffffff80,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x214429);
    __last = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x214444);
    this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,_std::allocator<int>_> *)this_00._M_current,in_stack_ffffffffffffffd8,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
  }
  std::shared_ptr<clickhouse::ColumnVector<int>_>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnVector<int>_> *)0x2144a5);
  return;
}

Assistant:

void ColumnVector<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnVector<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}